

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O3

int32_t __thiscall
icu_63::UnicodeString::moveIndex32(UnicodeString *this,int32_t index,int32_t delta)

{
  short sVar1;
  char16_t cVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  char16_t *pcVar9;
  
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar6 = (this->fUnion).fFields.fLength;
  }
  else {
    uVar6 = (int)sVar1 >> 5;
  }
  uVar3 = index;
  if ((int)uVar6 < index) {
    uVar3 = uVar6;
  }
  uVar4 = 0;
  if (-1 < index) {
    uVar4 = uVar3;
  }
  if (((int)sVar1 & 2U) == 0) {
    pcVar9 = (this->fUnion).fFields.fArray;
  }
  else {
    pcVar9 = (char16_t *)((long)&this->fUnion + 2);
  }
  if (delta < 1) {
    if ((delta != 0) && (0 < (int)uVar4)) {
      iVar8 = -delta;
      uVar5 = (ulong)uVar3;
      do {
        uVar6 = (uint)uVar5;
        uVar7 = (ulong)(uVar6 - 1);
        if ((((pcVar9[uVar7] & 0xfc00U) == 0xdc00) && (1 < uVar6)) &&
           ((pcVar9[uVar5 - 2] & 0xfc00U) == 0xd800)) {
          uVar7 = (ulong)(uVar6 - 2);
        }
        uVar5 = uVar7;
        uVar4 = (uint)uVar5;
      } while ((1 < iVar8) && (iVar8 = iVar8 + -1, 0 < (int)uVar4));
    }
  }
  else {
    iVar8 = delta + 1;
    do {
      if ((int)uVar4 < (int)uVar6) {
        cVar2 = pcVar9[(int)uVar4];
      }
      else if ((-1 < (int)uVar6) || (cVar2 = pcVar9[(int)uVar4], cVar2 == L'\0')) {
        return uVar4;
      }
      uVar3 = uVar4 + 1;
      if ((((cVar2 & 0xfc00U) == 0xd800) && (uVar3 != uVar6)) &&
         ((pcVar9[(int)uVar3] & 0xfc00U) == 0xdc00)) {
        uVar3 = uVar4 + 2;
      }
      uVar4 = uVar3;
      iVar8 = iVar8 + -1;
    } while (1 < iVar8);
  }
  return uVar4;
}

Assistant:

inline UBool
UnicodeString::hasShortLength() const {
  return fUnion.fFields.fLengthAndFlags>=0;
}